

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

pair<int,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,int groupIndex)

{
  string_view sVar1;
  string_view str;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  char *pcVar5;
  reference pvVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar7;
  bool local_1e9;
  bool local_1c9;
  undefined1 local_1c8 [8];
  BFSEntry qe_1;
  cmValue val;
  cmAlphaNum local_180;
  undefined1 local_150 [8];
  string var;
  BFSEntry qe;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  cmListFileBacktrace local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_88;
  reference local_58;
  LinkEntry *entry;
  int index;
  undefined1 local_40;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_> local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> lei;
  int groupIndex_local;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  
  lei._12_4_ = groupIndex;
  pVar7 = AllocateLinkEntry(this,item);
  _index = pVar7.first._M_node;
  local_40 = pVar7.second;
  local_38._M_node = _index;
  lei.first._M_node._0_1_ = local_40;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>::operator->(&local_38);
    entry._7_1_ = 0;
    std::pair<int,_bool>::pair<int_&,_bool,_true>
              ((pair<int,_bool> *)&this_local,&ppVar3->second,(bool *)((long)&entry + 7));
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>::operator->(&local_38);
    entry._0_4_ = ppVar3->second;
    local_58 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(long)(int)entry);
    psVar4 = cmLinkItem::AsStr_abi_cxx11_(item);
    std::__cxx11::string::string((string *)&local_a8,(string *)psVar4);
    cmListFileBacktrace::cmListFileBacktrace(&local_b8,&item->Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_88,&local_a8,&local_b8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&local_58->Item,&local_88);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_88);
    cmListFileBacktrace::~cmListFileBacktrace(&local_b8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_58->Target = item->Target;
    bVar2 = false;
    local_1e9 = false;
    if (local_58->Target == (cmGeneratorTarget *)0x0) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
      local_1e9 = false;
      if (*pcVar5 == '-') {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        local_1e9 = false;
        if (*pcVar5 != 'l') {
          std::__cxx11::string::substr((ulong)&local_e8,(ulong)local_58);
          bVar2 = true;
          local_1e9 = std::operator!=(&local_e8,"-framework");
        }
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_e8);
    }
    if (local_1e9 == false) {
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
      sVar1._M_str = DAT_01006288;
      sVar1._M_len = (anonymous_namespace)::LG_BEGIN;
      bVar2 = cmHasPrefix(str,sVar1);
      if (bVar2) {
        sVar1 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
        bVar2 = cmHasSuffix(sVar1,'>');
        if (bVar2) {
          local_58->Kind = Group;
        }
      }
    }
    else {
      local_58->Kind = Flag;
    }
    if (local_58->Kind != Group) {
      if (local_58->Target == (cmGeneratorTarget *)0x0) {
        cmAlphaNum::cmAlphaNum(&local_180,(string *)local_58);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&val,"_LIB_DEPENDS");
        cmStrCat<>((string *)local_150,&local_180,(cmAlphaNum *)&val);
        qe_1.LibDepends = (char *)cmMakefile::GetDefinition(this->Makefile,(string *)local_150);
        bVar2 = cmValue::operator_cast_to_bool((cmValue *)&qe_1.LibDepends);
        if (bVar2) {
          local_1c8._0_4_ = (int)entry;
          local_1c8._4_4_ = lei._12_4_;
          cmValue::operator->[abi_cxx11_((cmValue *)&qe_1.LibDepends);
          qe_1._0_8_ = std::__cxx11::string::c_str();
          std::
          queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
          ::push(&this->BFSQueue,(value_type *)local_1c8);
        }
        else if (local_58->Kind != Flag) {
          pvVar6 = std::
                   vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                   ::operator[](&this->InferredDependSets,(long)(int)entry);
          pvVar6->Initialized = true;
        }
        std::__cxx11::string::~string((string *)local_150);
      }
      else {
        var.field_2._8_4_ = (int)entry;
        var.field_2._12_4_ = lei._12_4_;
        std::
        queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
        ::push(&this->BFSQueue,(value_type *)((long)&var.field_2 + 8));
      }
    }
    local_1c9 = true;
    std::pair<int,_bool>::pair<int_&,_bool,_true>
              ((pair<int,_bool> *)&this_local,(int *)&entry,&local_1c9);
  }
  return (pair<int,_bool>)this_local;
}

Assistant:

std::pair<int, bool> cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item,
                                                        int groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}